

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void cpacr_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  ArchCPU_conflict2 *pAVar4;
  uint local_24;
  uint64_t uStack_20;
  uint32_t mask;
  uint64_t value_local;
  ARMCPRegInfo_conflict *ri_local;
  CPUARMState_conflict *env_local;
  
  local_24 = 0;
  iVar2 = arm_feature(env,0x1b);
  uStack_20 = value;
  if (iVar2 == 0) {
    pAVar4 = env_archcpu(env);
    _Var1 = isar_feature_aa32_vfp_simd(&pAVar4->isar);
    if (_Var1) {
      local_24 = 0xc0f00000;
      iVar2 = arm_feature(env,8);
      if (iVar2 == 0) {
        uStack_20 = value | 0x80000000;
      }
      pAVar4 = env_archcpu(env);
      _Var1 = isar_feature_aa32_simd_r32(&pAVar4->isar);
      if (!_Var1) {
        uStack_20 = uStack_20 | 0x40000000;
      }
    }
    uStack_20 = local_24 & uStack_20;
  }
  iVar2 = arm_feature(env,0x21);
  if ((((iVar2 != 0) && (_Var1 = arm_el_is_aa64(env,3), !_Var1)) &&
      (_Var1 = arm_is_secure(env), !_Var1)) &&
     (uVar3 = extract32((env->cp15).nsacr,10,1), uVar3 == 0)) {
    uStack_20 = (env->cp15).cpacr_el1 & 0xf00000 | uStack_20 & 0xffffffffff0fffff;
  }
  (env->cp15).cpacr_el1 = uStack_20;
  return;
}

Assistant:

static void cpacr_write(CPUARMState *env, const ARMCPRegInfo *ri,
                        uint64_t value)
{
    uint32_t mask = 0;

    /* In ARMv8 most bits of CPACR_EL1 are RES0. */
    if (!arm_feature(env, ARM_FEATURE_V8)) {
        /* ARMv7 defines bits for unimplemented coprocessors as RAZ/WI.
         * ASEDIS [31] and D32DIS [30] are both UNK/SBZP without VFP.
         * TRCDIS [28] is RAZ/WI since we do not implement a trace macrocell.
         */
        if (cpu_isar_feature(aa32_vfp_simd, env_archcpu(env))) {
            /* VFP coprocessor: cp10 & cp11 [23:20] */
            mask |= (1UL << 31) | (1 << 30) | (0xf << 20);

            if (!arm_feature(env, ARM_FEATURE_NEON)) {
                /* ASEDIS [31] bit is RAO/WI */
                value |= (1UL << 31);
            }

            /* VFPv3 and upwards with NEON implement 32 double precision
             * registers (D0-D31).
             */
            if (!cpu_isar_feature(aa32_simd_r32, env_archcpu(env))) {
                /* D32DIS [30] is RAO/WI if D16-31 are not implemented. */
                value |= (1 << 30);
            }
        }
        value &= mask;
    }

    /*
     * For A-profile AArch32 EL3 (but not M-profile secure mode), if NSACR.CP10
     * is 0 then CPACR.{CP11,CP10} ignore writes and read as 0b00.
     */
    if (arm_feature(env, ARM_FEATURE_EL3) && !arm_el_is_aa64(env, 3) &&
        !arm_is_secure(env) && !extract32(env->cp15.nsacr, 10, 1)) {
        value &= ~(0xf << 20);
        value |= env->cp15.cpacr_el1 & (0xf << 20);
    }

    env->cp15.cpacr_el1 = value;
}